

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O1

void test_23(QPDF *pdf,char *arg2)

{
  undefined8 uVar1;
  long lVar2;
  undefined8 uVar3;
  long lVar4;
  undefined8 uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  QPDFPageObjectHelper QVar7;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> pages;
  QPDFPageDocumentHelper dh;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> local_40 [8];
  long local_38;
  QPDFPageDocumentHelper local_28;
  
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&local_28,pdf);
  QPDFPageDocumentHelper::getAllPages();
  uVar1 = *(undefined8 *)(local_38 + -0x30);
  lVar2 = *(long *)(local_38 + -0x28);
  if (lVar2 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar2 + 8) = *(int *)(lVar2 + 8) + 1;
    }
  }
  uVar3 = *(undefined8 *)(local_38 + -0x20);
  lVar4 = *(long *)(local_38 + -0x18);
  if (lVar4 != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(lVar4 + 8) = *(int *)(lVar4 + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(lVar4 + 8) = *(int *)(lVar4 + 8) + 1;
    }
  }
  uVar5 = *(undefined8 *)(local_38 + -0x10);
  _Var6._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_38 + -8);
  if (_Var6._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (_Var6._M_pi)->_M_use_count = (_Var6._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (_Var6._M_pi)->_M_use_count = (_Var6._M_pi)->_M_use_count + 1;
    }
  }
  QVar7._8_8_ = uVar1;
  QVar7._0_8_ = &PTR__QPDFPageObjectHelper_001599e0;
  QVar7._16_8_ = lVar2;
  QVar7._24_8_ = uVar3;
  QVar7._32_8_ = lVar4;
  QVar7.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)uVar5;
  QVar7.m.super___shared_ptr<QPDFPageObjectHelper::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var6._M_pi;
  QPDFPageDocumentHelper::removePage(QVar7);
  QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)&stack0xffffffffffffff88);
  std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(local_40);
  QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&local_28);
  return;
}

Assistant:

static void
test_23(QPDF& pdf, char const* arg2)
{
    QPDFPageDocumentHelper dh(pdf);
    std::vector<QPDFPageObjectHelper> pages = dh.getAllPages();
    dh.removePage(pages.back());
}